

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_malloc_stats_print(write_cb_t *write_cb,void *cbopaque,char *opts)

{
  tsd_t *tsd;
  long *in_FS_OFFSET;
  buf_writer_t buf_writer;
  buf_writer_t bStack_58;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  duckdb_je_buf_writer_init((tsdn_t *)tsd,&bStack_58,write_cb,cbopaque,(char *)0x0,0x10000);
  duckdb_je_stats_print(duckdb_je_buf_writer_cb,&bStack_58,opts);
  duckdb_je_buf_writer_terminate((tsdn_t *)tsd,&bStack_58);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	tsdn_t *tsdn;

	LOG("core.malloc_stats_print.entry", "");

	tsdn = tsdn_fetch();
	check_entry_exit_locking(tsdn);

	if (config_debug) {
		stats_print(write_cb, cbopaque, opts);
	} else {
		buf_writer_t buf_writer;
		buf_writer_init(tsdn, &buf_writer, write_cb, cbopaque, NULL,
		    STATS_PRINT_BUFSIZE);
		stats_print(buf_writer_cb, &buf_writer, opts);
		buf_writer_terminate(tsdn, &buf_writer);
	}

	check_entry_exit_locking(tsdn);
	LOG("core.malloc_stats_print.exit", "");
}